

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m2C02.cpp
# Opt level: O1

uint8_t __thiscall m2C02::cpuRead(m2C02 *this,uint16_t addr,bool bReadOnly)

{
  byte bVar1;
  undefined1 uVar2;
  short sVar3;
  uint8_t uVar4;
  undefined7 in_register_00000011;
  
  if ((int)CONCAT71(in_register_00000011,bReadOnly) == 0) {
    if (addr == 7) {
      uVar2 = this->ppuDataBuffer;
      uVar4 = ppuRead(this,(this->vramAddr).reg,false);
      this->ppuDataBuffer = uVar4;
      if ((this->vramAddr).reg < 0x3f00) {
        uVar4 = uVar2;
      }
      sVar3 = 1;
      if (((this->control).reg & 4) != 0) {
        sVar3 = 0x20;
      }
      (this->vramAddr).reg = (this->vramAddr).reg + sVar3;
      return uVar4;
    }
    if (addr == 2) {
      bVar1 = (this->status).reg;
      (this->status).reg = bVar1 & 0x7f;
      this->addressLatch = '\0';
      return this->ppuDataBuffer & 0x1f | bVar1 & 0xe0;
    }
  }
  else {
    if (addr == 2) {
      return (this->status).reg;
    }
    if (addr == 1) {
      return (this->mask).reg;
    }
    if (addr == 0) {
      return (this->control).reg;
    }
  }
  return '\0';
}

Assistant:

uint8_t m2C02::cpuRead(uint16_t addr, bool bReadOnly) const
{
  uint8_t data = 0x00u;
  if (bReadOnly)
  {
    switch (addr)
    {
    case 0x0000u: // Control
      data = control.reg;
      break;
    case 0x0001u: // Mask
      data = mask.reg;
      break;
    case 0x0002u: // Status
      data = status.reg;
      break;
    case 0x0003u: // OAM Address
      break;
    case 0x0004u: // OAM Data
      break;
    case 0x0005u: // Scroll
      break;
    case 0x0006u: // PPU Address
      break;
    case 0x0007u: // PPU Data
      break;
    default:
      break;
    }
  }
  else
  {
    switch (addr)
    {
    case 0x0000u: // Control
      break;
    case 0x0001u: // Mask
      break;
    case 0x0002u: // Status
      data = (status.reg & 0xE0u) | (ppuDataBuffer & 0x1Fu);
      status.vertical_blank = 0;
      addressLatch = 0;
      break;
    case 0x0003u: // OAM Address
      break;
    case 0x0004u: // OAM Data
      break;
    case 0x0005u: // Scroll
      break;
    case 0x0006u: // PPU Address
      break;
    case 0x0007u: // PPU Data
      data = ppuDataBuffer;
      ppuDataBuffer = ppuRead(vramAddr.reg);

      if (vramAddr.reg >= 0x3F00u)
      {
        data = ppuDataBuffer;
      }
      vramAddr.reg += (control.increment_mode ? 32 : 1);
      break;
    default:
      break;
    }
  }

  return data;
}